

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxContext.cpp
# Opt level: O0

void __thiscall
sf::priv::GlxContext::createSurface
          (GlxContext *this,GlxContext *shared,uint width,uint height,uint bitsPerPixel)

{
  long lVar1;
  GLXPbuffer GVar2;
  Window WVar3;
  bool local_139;
  undefined1 local_130 [8];
  XSetWindowAttributes attributes;
  undefined4 local_b8;
  int screen;
  int attributes_1 [6];
  XVisualInfo *visual;
  int i;
  GLXFBConfig *configs;
  undefined8 *puStack_80;
  int nbConfigs;
  GLXFBConfig *config;
  int local_70;
  int iStack_6c;
  bool hasCreatePbuffer;
  int minor;
  int major;
  XVisualInfo visualInfo;
  uint bitsPerPixel_local;
  uint height_local;
  uint width_local;
  GlxContext *shared_local;
  GlxContext *this_local;
  
  visualInfo.bits_per_rgb = bitsPerPixel;
  selectBestVisual((XVisualInfo *)&minor,this->m_display,bitsPerPixel,
                   &(this->super_GlContext).m_settings);
  if ((shared != (GlxContext *)0x0) && (sfglx_ext_SGIX_pbuffer == 1)) {
    iStack_6c = 0;
    local_70 = 0;
    glXQueryVersion(this->m_display,&stack0xffffffffffffff94,&local_70);
    local_139 = 1 < iStack_6c || 2 < local_70;
    config._7_1_ = local_139;
    if (1 < iStack_6c || 2 < local_70) {
      puStack_80 = (undefined8 *)0x0;
      configs._4_4_ = 0;
      lVar1 = glXChooseFBConfig(this->m_display,*(undefined4 *)(this->m_display + 0xe0),0,
                                (long)&configs + 4);
      for (visual._4_4_ = 0; lVar1 != 0 && visual._4_4_ < configs._4_4_;
          visual._4_4_ = visual._4_4_ + 1) {
        attributes_1._16_8_ =
             glXGetVisualFromFBConfig
                       (this->m_display,*(undefined8 *)(lVar1 + (long)visual._4_4_ * 8));
        if (attributes_1._16_8_ != 0) {
          if (*(Visual **)(attributes_1._16_8_ + 8) == visualInfo.visual) {
            puStack_80 = (undefined8 *)(lVar1 + (long)visual._4_4_ * 8);
            XFree(attributes_1._16_8_);
            break;
          }
          XFree(attributes_1._16_8_);
        }
      }
      if (puStack_80 != (undefined8 *)0x0) {
        local_b8 = 0x8041;
        attributes_1[0] = 0x8040;
        attributes_1[2] = 0;
        attributes_1[3] = 0;
        screen = width;
        attributes_1[1] = height;
        GVar2 = glXCreatePbuffer(this->m_display,*puStack_80,&local_b8);
        this->m_pbuffer = GVar2;
        updateSettingsFromVisualInfo(this,(XVisualInfo *)&minor);
        XFree(lVar1);
        return;
      }
      if (lVar1 != 0) {
        XFree(lVar1);
      }
    }
  }
  attributes.cursor._4_4_ = *(int *)(this->m_display + 0xe0);
  attributes._88_8_ =
       XCreateColormap(this->m_display,
                       *(undefined8 *)
                        (*(long *)(this->m_display + 0xe8) + (long)attributes.cursor._4_4_ * 0x80 +
                        0x10),_minor,0);
  WVar3 = XCreateWindow(this->m_display,
                        *(undefined8 *)
                         (*(long *)(this->m_display + 0xe8) + (long)attributes.cursor._4_4_ * 0x80 +
                         0x10),0,0,width,height,0,
                        *(undefined4 *)
                         (*(long *)(this->m_display + 0xe8) + (long)attributes.cursor._4_4_ * 0x80 +
                         0x38),1,_minor,0x2000,local_130);
  this->m_window = WVar3;
  this->m_ownsWindow = true;
  updateSettingsFromWindow(this);
  return;
}

Assistant:

void GlxContext::createSurface(GlxContext* shared, unsigned int width, unsigned int height, unsigned int bitsPerPixel)
{
    // Choose the visual according to the context settings
    XVisualInfo visualInfo = selectBestVisual(m_display, bitsPerPixel, m_settings);

    // Check if the shared context already exists and pbuffers are supported
    if (shared && (sfglx_ext_SGIX_pbuffer == sfglx_LOAD_SUCCEEDED))
    {
        // There are no GLX versions prior to 1.0
        int major = 0;
        int minor = 0;

        glXQueryVersion(m_display, &major, &minor);

        // Check if glXCreatePbuffer is available (requires GLX 1.3 or greater)
        bool hasCreatePbuffer = ((major > 1) || (minor >= 3));

        if (hasCreatePbuffer)
        {
            // Get a GLXFBConfig that matches the visual
            GLXFBConfig* config = NULL;

            // We don't supply attributes to match against, since
            // the visual we are matching against was already
            // deemed suitable in selectBestVisual()
            int nbConfigs = 0;
            GLXFBConfig* configs = glXChooseFBConfig(m_display, DefaultScreen(m_display), NULL, &nbConfigs);

            for (int i = 0; configs && (i < nbConfigs); ++i)
            {
                XVisualInfo* visual = glXGetVisualFromFBConfig(m_display, configs[i]);

                if (!visual)
                    continue;

                if (visual->visualid == visualInfo.visualid)
                {
                    config = &configs[i];
                    XFree(visual);
                    break;
                }

                XFree(visual);
            }

            if (config)
            {
                int attributes[] =
                {
                    GLX_PBUFFER_WIDTH,  static_cast<int>(width),
                    GLX_PBUFFER_HEIGHT, static_cast<int>(height),
                    0,                  0
                };

                m_pbuffer = glXCreatePbuffer(m_display, *config, attributes);

                updateSettingsFromVisualInfo(&visualInfo);

                XFree(configs);

                return;
            }

            if (configs)
                XFree(configs);
        }
    }

    // If pbuffers are not available we use a hidden window as the off-screen surface to draw to
    int screen = DefaultScreen(m_display);

    // Define the window attributes
    XSetWindowAttributes attributes;
    attributes.colormap = XCreateColormap(m_display, RootWindow(m_display, screen), visualInfo.visual, AllocNone);

    m_window = XCreateWindow(m_display,
                             RootWindow(m_display, screen),
                             0, 0,
                             width, height,
                             0,
                             DefaultDepth(m_display, screen),
                             InputOutput,
                             visualInfo.visual,
                             CWColormap,
                             &attributes);

    m_ownsWindow = true;

    updateSettingsFromWindow();
}